

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O3

void CVmObjGramProd::process_work_queue
               (CVmGramProdMem *mem,vmgramprod_tok *tok,size_t tok_cnt,CVmGramProdQueue *queues,
               CVmObjDict *dict)

{
  vmgram_alt_info **ppvVar1;
  int iVar2;
  CVmGramProdState *pCVar3;
  int iVar4;
  CVmGramProdState *pCVar5;
  CVmGramProdState *pCVar6;
  bool bVar7;
  CVmGramProdState *pCVar8;
  CVmGramProdState *pCVar9;
  
  do {
    if (queues->work_queue_ == (CVmGramProdState *)0x0) {
      if ((queues->success_list_ != (CVmGramProdMatchEntry *)0x0) ||
         (pCVar5 = queues->badness_queue_, pCVar5 == (CVmGramProdState *)0x0)) {
        return;
      }
      bVar7 = false;
      iVar4 = 0;
      pCVar6 = pCVar5;
      do {
        ppvVar1 = &pCVar6->altp_;
        pCVar6 = pCVar6->nxt_;
        iVar2 = (*ppvVar1)->badness;
        if (iVar2 < iVar4) {
          iVar4 = iVar2;
        }
        if (!bVar7) {
          iVar4 = iVar2;
        }
        bVar7 = true;
      } while (pCVar6 != (CVmGramProdState *)0x0);
      if (pCVar5 == (CVmGramProdState *)0x0) {
        return;
      }
      pCVar6 = (CVmGramProdState *)0x0;
      pCVar8 = (CVmGramProdState *)0x0;
      do {
        pCVar3 = pCVar5->nxt_;
        pCVar9 = pCVar5;
        if (pCVar5->altp_->badness == iVar4) {
          if (pCVar8 == (CVmGramProdState *)0x0) {
            queues->badness_queue_ = pCVar3;
          }
          else {
            pCVar8->nxt_ = pCVar3;
            pCVar6 = queues->work_queue_;
          }
          pCVar5->nxt_ = pCVar6;
          queues->work_queue_ = pCVar5;
          pCVar6 = pCVar5;
          pCVar9 = pCVar8;
        }
        pCVar5 = pCVar3;
        pCVar8 = pCVar9;
      } while (pCVar3 != (CVmGramProdState *)0x0);
      if (pCVar6 == (CVmGramProdState *)0x0) {
        return;
      }
    }
    process_work_queue_head(mem,tok,tok_cnt,queues,dict);
  } while( true );
}

Assistant:

void CVmObjGramProd::process_work_queue(VMG_ CVmGramProdMem *mem,
                                        const vmgramprod_tok *tok,
                                        size_t tok_cnt,
                                        CVmGramProdQueue *queues,
                                        CVmObjDict *dict)
{
    /* keep going until the work queue and badness queue are empty */
    for (;;)
    {
        /* 
         *   If the work queue is empty, fall back on the badness queue.
         *   Ignore the badness queue if we have any successful matches,
         *   since non-badness matches always take precedence over badness
         *   items. 
         */
        if (queues->work_queue_ == 0 && queues->success_list_ == 0)
        {
            int first;
            int min_badness;
            CVmGramProdState *cur;
            CVmGramProdState *prv;
            CVmGramProdState *nxt;
            
            /* find the lowest badness rating in the queue */
            for (first = TRUE, min_badness = 0, cur = queues->badness_queue_ ;
                 cur != 0 ; cur = cur->nxt_, first = FALSE)
            {
                /* 
                 *   if we're on the first item, note its badness as the
                 *   tentative minimum; otherwise, note the current item's
                 *   badness if it's lower than the lowest we've seen so
                 *   far 
                 */
                if (first || cur->altp_->badness < min_badness)
                    min_badness = cur->altp_->badness;
            }

            /* 
             *   move each of the items whose badness matches the minimum
             *   badness out of the badness queue and into the work queue 
             */
            for (cur = queues->badness_queue_, prv = 0 ; cur != 0 ;
                 cur = nxt)
            {
                /* remember the next item, in case we remove this one */
                nxt = cur->nxt_;
                
                /* if this item has minimum badness, move it */
                if (cur->altp_->badness == min_badness)
                {
                    /* unlink it from the badness queue */
                    if (prv == 0)
                        queues->badness_queue_ = cur->nxt_;
                    else
                        prv->nxt_ = cur->nxt_;

                    /* link it into the work queue */
                    cur->nxt_ = queues->work_queue_;
                    queues->work_queue_ = cur;
                }
                else
                {
                    /* 
                     *   this item is staying in the list - note it as the
                     *   item preceding the next item 
                     */
                    prv = cur;
                }
            }
        }

        /* if the work queue is still empty, we're out of work to do */
        if (queues->work_queue_ == 0)
            break;
        
        /* process the head of the work queue */
        process_work_queue_head(vmg_ mem, tok, tok_cnt, queues, dict);
    }
}